

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  byte bVar1;
  undefined8 *puVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long *plVar8;
  LogMessage *pLVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  long lVar12;
  _Alloc_hider _Var13;
  pointer pUVar14;
  long lVar15;
  bool bVar16;
  UnknownFieldSet intermediate_unknown_fields;
  undefined1 local_a8 [64];
  const_iterator local_68;
  const_iterator local_60;
  FieldDescriptor **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pUVar14 = (unknown_fields->fields_).
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(unknown_fields->fields_).
                               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar14) >> 4);
  bVar16 = (int)uVar5 < 1;
  local_60._M_current = intermediate_fields_end._M_current;
  local_58 = intermediate_fields_iter._M_current;
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    if (0 < (int)uVar5) {
      if (pUVar14->number_ != *(uint32_t *)(innermost_field + 4)) {
        uVar7 = (ulong)(uVar5 & 0x7fffffff);
        uVar3 = 1;
        do {
          uVar11 = uVar3;
          pUVar14 = pUVar14 + 1;
          if (uVar7 == uVar11) {
            return uVar7 <= uVar11;
          }
          uVar3 = uVar11 + 1;
        } while (pUVar14->number_ != *(uint32_t *)(innermost_field + 4));
        bVar16 = uVar7 <= uVar11;
      }
      std::operator+(&local_50,"Option \"",debug_msg_name);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 == paVar10) {
        local_a8._16_8_ = paVar10->_M_allocated_capacity;
        local_a8._24_8_ = plVar8[3];
        local_a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_a8 + 0x10);
      }
      else {
        local_a8._16_8_ = paVar10->_M_allocated_capacity;
        local_a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar8;
      }
      local_a8._8_8_ = plVar8[1];
      *plVar8 = (long)paVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_);
      }
      _Var13._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00365c52:
        operator_delete(_Var13._M_p);
      }
    }
  }
  else if (0 < (int)uVar5) {
    local_68._M_current = intermediate_fields_iter._M_current + 1;
    lVar15 = 8;
    lVar12 = 0;
    do {
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*local_58;
      if (*(int *)((long)pUVar14 + lVar15 + -8) == *(int *)(paVar10->_M_local_buf + 4)) {
        if (*(once_flag **)(paVar10->_M_local_buf + 0x18) != (once_flag *)0x0) {
          local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
          local_50._M_dataplus._M_p = (pointer)paVar10;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(paVar10->_M_local_buf + 0x18),
                     (_func_void_FieldDescriptor_ptr **)local_a8,(FieldDescriptor **)&local_50);
        }
        bVar1 = paVar10->_M_local_buf[2];
        if (bVar1 == 10) {
          if ((*(int *)((long)pUVar14 + lVar15 + -4) == 4) &&
             (bVar4 = ExamineIfOptionIsSet
                                (this,local_68,local_60,innermost_field,debug_msg_name,
                                 *(UnknownFieldSet **)((long)&pUVar14->number_ + lVar15)), !bVar4))
          {
            return bVar16;
          }
        }
        else {
          if (bVar1 != 0xb) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1cf9);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_a8,"Invalid wire type for CPPTYPE_MESSAGE: ");
            pLVar9 = internal::LogMessage::operator<<(pLVar9,(uint)bVar1);
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_a8);
            return bVar16;
          }
          if (*(int *)((long)pUVar14 + lVar15 + -4) == 3) {
            local_a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_a8._16_8_ = (pointer)0x0;
            if (*(int *)((long)pUVar14 + lVar15 + -4) != 3) {
              __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                            ,0x166,
                            "const std::string &google::protobuf::UnknownField::length_delimited() const"
                           );
            }
            puVar2 = *(undefined8 **)((long)&pUVar14->number_ + lVar15);
            bVar4 = UnknownFieldSet::ParseFromArray
                              ((UnknownFieldSet *)local_a8,(void *)*puVar2,*(int *)(puVar2 + 1));
            if ((bVar4) &&
               (bVar4 = ExamineIfOptionIsSet
                                  (this,local_68,local_60,innermost_field,debug_msg_name,
                                   (UnknownFieldSet *)local_a8), !bVar4)) {
              if (local_a8._0_8_ != local_a8._8_8_) {
                UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_a8);
              }
              _Var13._M_p = (pointer)local_a8._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                return bVar16;
              }
              goto LAB_00365c52;
            }
            if (local_a8._0_8_ != local_a8._8_8_) {
              UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_a8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_a8._0_8_);
            }
          }
        }
      }
      lVar12 = lVar12 + 1;
      pUVar14 = (unknown_fields->fields_).
                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)(int)((ulong)((long)(unknown_fields->fields_).
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar14)
                         >> 4);
      lVar15 = lVar15 + 0x10;
      bVar16 = lVar6 <= lVar12;
    } while (lVar12 < lVar6);
  }
  return bVar16;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const std::string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name, unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}